

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O2

_Bool simulate(Windows *gameInterface,UnitList *guardList,UnitList *inmateList,Path *path)

{
  int iVar1;
  UnitNode *pUVar2;
  Inmate *inmate;
  WINDOW *pWVar3;
  long lVar4;
  __syscall_slong_t _Var5;
  ulong uVar6;
  ulong uVar7;
  UnitList *pUVar8;
  int i;
  long lVar9;
  float fVar10;
  undefined8 uStack_60;
  int aiStack_58 [2];
  undefined1 local_50 [8];
  timespec delay;
  
  lVar4 = -((ulong)(uint)inmateList->count * 4 + 0xf & 0xfffffffffffffff0);
  local_50 = (undefined1  [8])0x0;
  delay.tv_sec = 50000000;
  delay.tv_nsec = (__syscall_slong_t)path;
  for (fVar10 = 0.0; fVar10 < 40.0; fVar10 = fVar10 + 0.25) {
    uVar6 = (ulong)(uint)inmateList->count;
    if (inmateList->count < 1) {
      uVar6 = 0;
    }
    pUVar8 = inmateList;
    for (uVar7 = 0; _Var5 = delay.tv_nsec, uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pUVar2 = pUVar8->head;
      *(int *)((long)aiStack_58 + uVar7 * 4 + lVar4 + -0x58 + 0x58) =
           (int)*(float *)((long)pUVar2->unit + 4);
      pUVar8 = (UnitList *)&pUVar2->next;
    }
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x104220;
    inmateMove(inmateList,(Path *)_Var5);
    pUVar8 = inmateList;
    for (lVar9 = 0; _Var5 = delay.tv_nsec, lVar9 < inmateList->count; lVar9 = lVar9 + 1) {
      pUVar2 = pUVar8->head;
      inmate = (Inmate *)pUVar2->unit;
      if (inmate->delUnit == false) {
        pWVar3 = gameInterface->body;
        iVar1 = *(int *)((long)aiStack_58 + lVar9 * 4 + lVar4 + -0x58 + 0x58);
        *(undefined8 *)((long)&uStack_60 + lVar4) = 0x10425d;
        redrawUnit(pWVar3,inmate,(Path *)_Var5,(float)iVar1);
      }
      else {
        *(undefined8 *)((long)&uStack_60 + lVar4) = 0x104247;
        dequeue(inmateList);
      }
      pUVar8 = (UnitList *)&pUVar2->next;
    }
    pWVar3 = gameInterface->body;
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x104281;
    wrefresh(pWVar3);
    *(undefined8 *)((long)&uStack_60 + lVar4) = 0x10428c;
    nanosleep((timespec *)local_50,(timespec *)0x0);
  }
  return true;
}

Assistant:

bool simulate(struct Windows *gameInterface,
    struct UnitList *guardList, struct UnitList *inmateList,
    struct Path *path) {

    struct UnitNode *nextInmate;
    float simulateTime = 0;
    int prevPos[inmateList->count];
    struct timespec delay;

    delay.tv_sec = 0;
    delay.tv_nsec = 50000000L;  // Half second in nano seconds

    while (simulateTime < 40) {

        nextInmate = getHead(inmateList);
        for (int i = 0; i < inmateList->count; i++) {
            prevPos[i] = ((struct Inmate *) nextInmate->unit)->position;
            nextInmate = nextInmate->next;
        }

        inmateMove(inmateList, path);
        //guardAttack(guardList, inmateList);
        nextInmate = getHead(inmateList);

        for (int i = 0; i < inmateList->count; i++) {
            if (((struct Inmate *) nextInmate->unit)->delUnit == FALSE)
                redrawUnit(gameInterface->body,
                    (struct Inmate *) nextInmate->unit, path, prevPos[i]);
            else {
                /*Call redraw but delete it?, or simply call eraseUnit in UI*/
                dequeue(inmateList);
            }
            nextInmate = nextInmate->next;
        }
        simulateTime += .25;
        wrefresh(gameInterface->body);
        nanosleep(&delay, NULL);
    }

    return true;  //TODO return win condition

}